

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printStatistics(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,ostream *os)

{
  int iVar1;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  ostream *in_stack_00000378;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000380;
  ostream *in_stack_00000508;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000510;
  ostream *in_stack_000006e0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000006e8;
  undefined8 in_stack_ffffffffffffffd8;
  char *os_00;
  ostream *in_stack_ffffffffffffffe0;
  
  SPxOut::setFixed(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  printStatus(in_RSI,(ostream *)in_RDI,(Status)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  std::operator<<((ostream *)in_RSI,"Original problem    : \n");
  iVar1 = intParam(in_RDI,READMODE);
  if (iVar1 == 0) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::printProblemStatistics(in_stack_00000510,in_stack_00000508);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::printProblemStatistics(in_stack_000006e8,in_stack_000006e0);
  }
  this_00 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)std::operator<<((ostream *)in_RSI,"Objective sense     : ");
  iVar1 = intParam(in_RDI,OBJSENSE);
  if (iVar1 == -1) {
    os_00 = "minimize\n";
  }
  else {
    os_00 = "maximize\n";
  }
  std::operator<<((ostream *)this_00,os_00);
  printSolutionStatistics(in_stack_00000380,in_stack_00000378);
  printSolvingStatistics(this_00,(ostream *)os_00);
  return;
}

Assistant:

void SoPlexBase<R>::printStatistics(std::ostream& os)
{
   SPxOut::setFixed(os, 2);

   printStatus(os, _status);

   os << "Original problem    : \n";

   if(intParam(SoPlexBase<R>::READMODE) == READMODE_REAL)
      _realLP->printProblemStatistics(os);
   else
      _rationalLP->printProblemStatistics(os);

   os << "Objective sense     : " << (intParam(SoPlexBase<R>::OBJSENSE) ==
                                      SoPlexBase<R>::OBJSENSE_MINIMIZE ? "minimize\n" : "maximize\n");
   printSolutionStatistics(os);
   printSolvingStatistics(os);
}